

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiSimulationDataGenerator.cpp
# Opt level: O2

U32 __thiscall
MidiSimulationDataGenerator::GenerateSimulationData
          (MidiSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channel)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  while( true ) {
    uVar2 = SimulationChannelDescriptor::GetCurrentSampleNumber();
    if (uVar1 <= uVar2) break;
    CreateMidiMessage(this);
  }
  *simulation_channel = &this->mMidiSimulationData;
  return 1;
}

Assistant:

U32 MidiSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                         SimulationChannelDescriptor** simulation_channel )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    while( mMidiSimulationData.GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        CreateMidiMessage();
    }

    *simulation_channel = &mMidiSimulationData;
    return 1;
}